

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.cpp
# Opt level: O1

void * SSC32Thread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int selectedchannels [32];
  CHRONO chrono_period;
  int pws [32];
  char szTemp [256];
  SSC32 ssc32;
  char szSaveFilePath [256];
  int local_db4;
  int local_dac;
  double local_da8;
  timespec local_d88;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  timespec local_d00;
  long local_cf0;
  long lStack_ce8;
  long local_ce0;
  long lStack_cd8;
  timespec local_cd0;
  int local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  double local_c38;
  undefined8 uStack_c30;
  undefined4 local_c28;
  undefined2 local_c24;
  SSC32 local_b20;
  char local_138 [264];
  
  memset(&local_b20,0,0x9e8);
  iVar4 = clock_getres(4,&local_cd0);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_d00), iVar4 == 0)) {
    local_cc0 = 0;
    local_cf0 = 0;
    lStack_ce8 = 0;
    local_ce0 = 0;
    lStack_cd8 = 0;
  }
  local_db4 = 0x32;
  bVar3 = false;
  bVar1 = false;
  local_dac = 0;
  do {
    while( true ) {
      if (local_cc0 == 0) {
        clock_gettime(4,&local_d88);
        local_cf0 = local_d88.tv_sec;
        lStack_ce8 = local_d88.tv_nsec;
        local_d88.tv_sec =
             (local_d88.tv_sec + local_ce0 + (local_d88.tv_nsec + lStack_cd8) / 1000000000) -
             local_d00.tv_sec;
        local_d88.tv_nsec = (local_d88.tv_nsec + lStack_cd8) % 1000000000 - local_d00.tv_nsec;
        if (local_d88.tv_nsec < 0) {
          local_d88.tv_sec = local_d88.tv_sec + local_d88.tv_nsec / 1000000000 + -1;
          local_d88.tv_nsec = local_d88.tv_nsec % 1000000000 + 1000000000;
        }
        local_ce0 = local_d88.tv_sec;
        lStack_cd8 = local_d88.tv_nsec;
      }
      iVar4 = clock_getres(4,&local_cd0);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,&local_d00), iVar4 == 0)) {
        local_cc0 = 0;
        local_ce0 = 0;
        lStack_cd8 = 0;
        local_cf0 = 0;
        lStack_ce8 = 0;
      }
      local_d88.tv_sec = (long)local_db4 / 1000;
      local_d88.tv_nsec = ((long)local_db4 % 1000) * 1000000;
      nanosleep(&local_d88,(timespec *)0x0);
      if (bPauseSSC32 == 0) break;
      if (bVar1) {
        puts("SSC32 paused.");
        iVar4 = CloseRS232Port(&local_b20.RS232Port);
        pcVar14 = "SSC32 disconnection failed.";
        if (iVar4 == 0) {
          pcVar14 = "SSC32 disconnected.";
        }
        puts(pcVar14);
      }
      if (bExit != 0) {
        bVar2 = true;
        goto LAB_0019b4aa;
      }
      local_d88.tv_sec = 0;
      local_d88.tv_nsec = 100000000;
      bVar1 = false;
      nanosleep(&local_d88,(timespec *)0x0);
    }
    if (bRestartSSC32 != 0) {
      if (bVar1) {
        puts("Restarting a SSC32.");
        iVar4 = CloseRS232Port(&local_b20.RS232Port);
        pcVar14 = "SSC32 disconnection failed.";
        if (iVar4 == 0) {
          pcVar14 = "SSC32 disconnected.";
        }
        puts(pcVar14);
      }
      bRestartSSC32 = 0;
      bVar1 = false;
    }
    if (bVar1) {
      if (robid < 0x4000) {
        if (robid == 0x400) {
          pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
          rudderminangle = local_b20.MinAngle;
          ruddermidangle = local_b20.MidAngle;
          ruddermaxangle = local_b20.MaxAngle;
          dVar19 = ABS(local_b20.MinAngle);
          if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
            dVar19 = ABS(local_b20.MaxAngle);
          }
          dVar19 = dVar19 * -uw_f;
          if (bEnableFluxMotorboat == 0) {
            if (bEnableBackwardsMotorboat == 0) {
              local_da8 = 0.0;
              if (0.0 <= u_f) {
                local_da8 = u_f;
              }
            }
            else {
              local_da8 = u_f;
            }
            pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
            goto LAB_0019ad93;
          }
          local_c38 = ABS(u_f);
          if (bEnableBackwardsMotorboat == 0) {
            local_c38 = (double)(~-(ulong)(u_f < 0.0) & (ulong)local_c38);
            local_da8 = 1.0;
          }
          else {
            local_da8 = *(double *)(&DAT_001de460 + (ulong)(u_f < 0.0) * 8);
          }
          uStack_c30 = 0;
          pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
          iVar4 = SetRudderThrustersFluxSSC32
                            (&local_b20,dVar19,local_c38,local_c38,local_da8,local_da8);
        }
        else {
          if (robid != 0x2000) goto LAB_0019afe7;
          if (!bVar3 && bCheckRudder != 0) {
            iVar4 = CheckRudderSSC32(&local_b20);
            if (iVar4 != 0) {
              puts("Connection to a SSC32 lost.");
              iVar4 = CloseRS232Port(&local_b20.RS232Port);
              if (iVar4 == 0) {
                pcVar14 = "SSC32 disconnected.";
              }
              else {
                pcVar14 = "SSC32 disconnection failed.";
              }
              puts(pcVar14);
              bVar2 = true;
              bVar3 = false;
              bVar1 = false;
              goto LAB_0019b262;
            }
            bVar3 = true;
          }
          pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
          rudderminangle = local_b20.MinAngle;
          ruddermidangle = local_b20.MidAngle;
          ruddermaxangle = local_b20.MaxAngle;
          dVar16 = -uw_f;
          dVar19 = ABS(local_b20.MinAngle);
          if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
            dVar19 = ABS(local_b20.MaxAngle);
          }
          pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
          if (0.0 <= dVar19 * dVar16) {
            dVar20 = local_b20.MaxAngle - local_b20.MidAngle;
          }
          else {
            dVar20 = local_b20.MidAngle - local_b20.MinAngle;
          }
          dVar18 = ABS(local_b20.MinAngle);
          if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
            dVar18 = ABS(local_b20.MaxAngle);
          }
          dVar17 = ABS(local_b20.MinAngle);
          if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
            dVar17 = ABS(local_b20.MaxAngle);
          }
          iVar4 = (int)(((local_b20.MidAngle + (dVar19 * dVar16 * dVar20) / dVar18) * 500.0) /
                       dVar17);
          if (499 < iVar4) {
            iVar4 = 500;
          }
          if (iVar4 < -499) {
            iVar4 = -500;
          }
          iVar4 = SetPWMSSC32(&local_b20,local_b20.rudderchan,iVar4 + 0x5dc);
        }
      }
      else if (((robid == 0x4000) || (robid == 0x200000)) || (robid == 0x8000)) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        local_da8 = u_f;
        rudderminangle = local_b20.MinAngle;
        ruddermidangle = local_b20.MidAngle;
        ruddermaxangle = local_b20.MaxAngle;
        dVar19 = ABS(local_b20.MinAngle);
        if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
          dVar19 = ABS(local_b20.MaxAngle);
        }
        dVar19 = dVar19 * -uw_f;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
LAB_0019ad93:
        iVar4 = SetRudderThrusterSSC32(&local_b20,dVar19,local_da8);
      }
      else {
LAB_0019afe7:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        dVar19 = u1 * 1000.0;
        dVar16 = u2 * 1000.0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        local_d88.tv_sec = 0;
        local_d88.tv_nsec = 0;
        local_d78 = 0;
        uStack_d70 = 0;
        local_d68 = 0;
        uStack_d60 = 0;
        local_d58 = 0;
        uStack_d50 = 0;
        local_d48 = 0;
        uStack_d40 = 0;
        local_d38 = 0;
        uStack_d30 = 0;
        local_d28 = 0;
        uStack_d20 = 0;
        local_cb8 = 0;
        uStack_cb0 = 0;
        local_ca8 = 0;
        uStack_ca0 = 0;
        local_c98 = 0;
        uStack_c90 = 0;
        local_c88 = 0;
        uStack_c80 = 0;
        local_c78 = 0;
        uStack_c70 = 0;
        local_c68 = 0;
        uStack_c60 = 0;
        local_c58 = 0;
        uStack_c50 = 0;
        local_c48 = 0;
        uStack_c40 = 0;
        lVar13 = (long)local_b20.rightthrusterchan;
        *(int *)((long)&local_cb8 + lVar13 * 4) = (int)(dVar19 * 0.5) + 0x5dc;
        lVar7 = (long)local_b20.leftthrusterchan;
        *(int *)((long)&local_cb8 + lVar7 * 4) = (int)(dVar16 * 0.5) + 0x5dc;
        iVar4 = *(int *)((long)&local_cb8 + lVar13 * 4);
        if (1999 < iVar4) {
          iVar4 = 2000;
        }
        if (iVar4 < 0x3e9) {
          iVar4 = 1000;
        }
        *(int *)((long)&local_cb8 + lVar13 * 4) = iVar4;
        iVar4 = *(int *)((long)&local_cb8 + lVar7 * 4);
        if (1999 < iVar4) {
          iVar4 = 2000;
        }
        local_d18 = 0;
        uStack_d10 = 0;
        if (iVar4 < 0x3e9) {
          iVar4 = 1000;
        }
        *(int *)((long)&local_cb8 + lVar7 * 4) = iVar4;
        *(undefined4 *)((long)&local_d88.tv_sec + lVar13 * 4) = 1;
        *(undefined4 *)((long)&local_d88.tv_sec + lVar7 * 4) = 1;
        iVar4 = SetAllPWMsSSC32(&local_b20,(int *)&local_d88,(int *)&local_cb8);
      }
      if (iVar4 == 0) {
LAB_0019b260:
        bVar1 = true;
        bVar2 = false;
      }
      else {
        puts("Connection to a SSC32 lost.");
        iVar4 = CloseRS232Port(&local_b20.RS232Port);
        if (iVar4 == 0) {
          pcVar14 = "SSC32 disconnected.";
        }
        else {
          pcVar14 = "SSC32 disconnection failed.";
        }
        puts(pcVar14);
LAB_0019af02:
        bVar1 = false;
        bVar2 = true;
      }
    }
    else {
      iVar4 = ConnectSSC32(&local_b20,"SSC320.txt");
      if (iVar4 != 0) {
        local_d88.tv_sec = 1;
        local_d88.tv_nsec = 0;
        nanosleep(&local_d88,(timespec *)0x0);
        goto LAB_0019af02;
      }
      local_db4 = local_b20.threadperiod;
      if ((FILE *)local_b20.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_b20.pfSaveFile);
        local_b20.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = false;
      bVar1 = true;
      if ((local_b20.bSaveRawData != 0) && ((FILE *)local_b20.pfSaveFile == (FILE *)0x0)) {
        if (local_b20.szCfgFilePath[0] == '\0') {
          local_c24 = 0x32;
          local_c28 = 0x33637373;
        }
        else {
          sprintf((char *)&local_c28,"%.127s",local_b20.szCfgFilePath);
        }
        sVar6 = strlen((char *)&local_c28);
        uVar5 = (uint)sVar6;
        uVar12 = sVar6 & 0xffffffff;
        uVar8 = (int)uVar5 >> 0x1f & uVar5;
        uVar11 = sVar6 & 0xffffffff;
        do {
          uVar12 = uVar12 - 1;
          uVar10 = (uint)uVar11;
          uVar11 = (ulong)(uVar8 - 1);
          uVar9 = uVar8;
          if ((int)uVar10 < 1) break;
          uVar11 = (ulong)(uVar10 - 1);
          uVar9 = uVar10;
        } while (*(char *)((long)&local_c28 + (uVar12 & 0xffffffff)) != '.');
        if ((int)uVar9 <= (int)uVar5 && 1 < (int)uVar9) {
          memset((void *)((long)&local_c28 + uVar11),0,sVar6 - uVar11);
        }
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar14 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.txt",&local_c28,pcVar14);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_b20.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_b20.pfSaveFile != (FILE *)0x0) goto LAB_0019b260;
        puts("Unable to create SSC32 data file.");
        bVar2 = false;
        break;
      }
    }
LAB_0019b262:
    if ((bVar2) &&
       (local_dac = local_dac + 1, ExitOnErrorCount <= local_dac && 0 < ExitOnErrorCount)) {
      bExit = 1;
    }
  } while (bExit == 0);
LAB_0019b4aa:
  if (robid < 0x4000) {
    if (robid == 0x400) {
      if (bEnableFluxMotorboat != 0) goto LAB_0019b635;
      local_d88.tv_sec = 0;
      local_d88.tv_nsec = 0;
      local_d78 = 0;
      uStack_d70 = 0;
      local_d68 = 0;
      uStack_d60 = 0;
      local_d58 = 0;
      uStack_d50 = 0;
      local_d48 = 0;
      uStack_d40 = 0;
      local_d38 = 0;
      uStack_d30 = 0;
      local_d28 = 0;
      uStack_d20 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_ca8 = 0;
      uStack_ca0 = 0;
      local_c98 = 0;
      uStack_c90 = 0;
      local_c88 = 0;
      uStack_c80 = 0;
      local_c78 = 0;
      uStack_c70 = 0;
      local_c68 = 0;
      uStack_c60 = 0;
      local_c58 = 0;
      uStack_c50 = 0;
      local_c48 = 0;
      uStack_c40 = 0;
      dVar19 = ABS(local_b20.MinAngle);
      if (ABS(local_b20.MinAngle) <= ABS(local_b20.MaxAngle)) {
        dVar19 = ABS(local_b20.MaxAngle);
      }
      *(int *)((long)&local_cb8 + (long)local_b20.rudderchan * 4) =
           (int)(((((local_b20.MaxAngle - local_b20.MidAngle) * 0.0) / dVar19 + local_b20.MidAngle)
                 * 500.0) / dVar19) + 0x5dc;
      lVar7 = (long)local_b20.rightthrusterchan;
      *(undefined4 *)((long)&local_cb8 + lVar7 * 4) = 0x5dc;
      lVar13 = (long)local_b20.rudderchan;
      iVar4 = *(int *)((long)&local_cb8 + lVar13 * 4);
      if (1999 < iVar4) {
        iVar4 = 2000;
      }
      if (iVar4 < 0x3e9) {
        iVar4 = 1000;
      }
      *(int *)((long)&local_cb8 + lVar13 * 4) = iVar4;
      iVar4 = *(int *)((long)&local_cb8 + lVar7 * 4);
      iVar15 = 2000;
      if (iVar4 < 2000) {
        iVar15 = iVar4;
      }
      local_d18 = 0;
      uStack_d10 = 0;
      if (iVar15 < 0x3e9) {
        iVar15 = 1000;
      }
      *(int *)((long)&local_cb8 + lVar7 * 4) = iVar15;
      *(undefined4 *)((long)&local_d88.tv_sec + lVar13 * 4) = 1;
      *(undefined4 *)((long)&local_d88.tv_sec + lVar7 * 4) = 1;
      SetAllPWMsSSC32(&local_b20,(int *)&local_d88,(int *)&local_cb8);
    }
    else {
      if (robid == 0x2000) goto LAB_0019b69d;
LAB_0019b4f3:
      local_d88.tv_sec = 0;
      local_d88.tv_nsec = 0;
      local_d78 = 0;
      uStack_d70 = 0;
      local_d68 = 0;
      uStack_d60 = 0;
      local_d58 = 0;
      uStack_d50 = 0;
      local_d48 = 0;
      uStack_d40 = 0;
      local_d38 = 0;
      uStack_d30 = 0;
      local_d28 = 0;
      uStack_d20 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_ca8 = 0;
      uStack_ca0 = 0;
      local_c98 = 0;
      uStack_c90 = 0;
      local_c88 = 0;
      uStack_c80 = 0;
      local_c78 = 0;
      uStack_c70 = 0;
      local_c68 = 0;
      uStack_c60 = 0;
      local_c58 = 0;
      uStack_c50 = 0;
      local_c48 = 0;
      uStack_c40 = 0;
      lVar7 = (long)local_b20.rightthrusterchan;
      *(undefined4 *)((long)&local_cb8 + lVar7 * 4) = 0x5dc;
      lVar13 = (long)local_b20.leftthrusterchan;
      *(undefined4 *)((long)&local_cb8 + lVar13 * 4) = 0x5dc;
      iVar4 = *(int *)((long)&local_cb8 + lVar7 * 4);
      if (1999 < iVar4) {
        iVar4 = 2000;
      }
      if (iVar4 < 0x3e9) {
        iVar4 = 1000;
      }
      *(int *)((long)&local_cb8 + lVar7 * 4) = iVar4;
      iVar4 = *(int *)((long)&local_cb8 + lVar13 * 4);
      iVar15 = 2000;
      if (iVar4 < 2000) {
        iVar15 = iVar4;
      }
      local_d18 = 0;
      uStack_d10 = 0;
      if (iVar15 < 0x3e9) {
        iVar15 = 1000;
      }
      *(int *)((long)&local_cb8 + lVar13 * 4) = iVar15;
      *(undefined4 *)((long)&local_d88.tv_sec + lVar7 * 4) = 1;
      *(undefined4 *)((long)&local_d88.tv_sec + lVar13 * 4) = 1;
      SetAllPWMsSSC32(&local_b20,(int *)&local_d88,(int *)&local_cb8);
    }
  }
  else {
    if ((robid == 0x4000) || (robid == 0x8000)) goto LAB_0019b69d;
    if (robid != 0x200000) goto LAB_0019b4f3;
LAB_0019b635:
    SetRudderThrustersFluxSSC32(&local_b20,0.0,0.0,0.0,0.0,0.0);
  }
  local_d88.tv_sec = (long)local_db4 / 1000;
  local_d88.tv_nsec = ((long)local_db4 % 1000) * 1000000;
  nanosleep(&local_d88,(timespec *)0x0);
LAB_0019b69d:
  if (local_cc0 == 0) {
    clock_gettime(4,&local_d88);
    local_cf0 = local_d88.tv_sec;
    lStack_ce8 = local_d88.tv_nsec;
    local_d88.tv_sec =
         (local_d88.tv_sec + local_ce0 + (local_d88.tv_nsec + lStack_cd8) / 1000000000) -
         local_d00.tv_sec;
    local_d88.tv_nsec = (local_d88.tv_nsec + lStack_cd8) % 1000000000 - local_d00.tv_nsec;
    if (local_d88.tv_nsec < 0) {
      local_d88.tv_sec = local_d88.tv_sec + local_d88.tv_nsec / 1000000000 + -1;
      local_d88.tv_nsec = local_d88.tv_nsec % 1000000000 + 1000000000;
    }
    local_ce0 = local_d88.tv_sec;
    lStack_cd8 = local_d88.tv_nsec;
  }
  if ((FILE *)local_b20.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_b20.pfSaveFile);
    local_b20.pfSaveFile = (FILE *)0x0;
  }
  if (!bVar2) {
    iVar4 = CloseRS232Port(&local_b20.RS232Port);
    pcVar14 = "SSC32 disconnection failed.";
    if (iVar4 == 0) {
      pcVar14 = "SSC32 disconnected.";
    }
    puts(pcVar14);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SSC32Thread(void* pParam)
{
	SSC32 ssc32;
	double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bRudderChecked = FALSE;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ssc32, 0, sizeof(SSC32));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseSSC32) 
		{
			if (bConnected)
			{
				printf("SSC32 paused.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSSC32) 
		{
			if (bConnected)
			{
				printf("Restarting a SSC32.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			bRestartSSC32 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSSC32(&ssc32, "SSC320.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ssc32.threadperiod;

				if (ssc32.pfSaveFile != NULL)
				{
					fclose(ssc32.pfSaveFile); 
					ssc32.pfSaveFile = NULL;
				}
				if ((ssc32.bSaveRawData)&&(ssc32.pfSaveFile == NULL)) 
				{
					if (strlen(ssc32.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ssc32.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ssc32");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ssc32.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (ssc32.pfSaveFile == NULL) 
					{
						printf("Unable to create SSC32 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUGGY_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case VAIMOS_ROBID:
				if ((bCheckRudder)&&(!bRudderChecked))
				{
					if (CheckRudderSSC32(&ssc32) != EXIT_SUCCESS)
					{
						printf("Connection to a SSC32 lost.\n");
						bConnected = FALSE;
						DisconnectSSC32(&ssc32);
						break;
					}
					bRudderChecked = TRUE;
				}
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderSSC32(&ssc32, rudder) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case MOTORBOAT_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				if (bEnableFluxMotorboat)
				{
				thrust = fabs(u_f);
				if (bEnableBackwardsMotorboat)
				{
					if (u_f < 0) flux = -1; else flux = 1;
				}
				else
				{
					if (u_f < 0) thrust = 0;
					flux = 1;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrustersFluxSSC32(&ssc32, rudder, thrust, thrust, flux, flux) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				else
				{
				thrust = u_f;
				if (!bEnableBackwardsMotorboat)
				{
					if (u_f < 0) thrust = 0;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersSSC32(&ssc32, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			}
		}

		//printf("SSC32Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUGGY_ROBID:
		SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0);
		mSleep(threadperiod);
		break;
	case SAILBOAT_ROBID:
	case SAILBOAT2_ROBID:
	case VAIMOS_ROBID:
		break;
	case MOTORBOAT_ROBID:
		if (bEnableFluxMotorboat) SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0); else SetRudderThrusterSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (ssc32.pfSaveFile != NULL)
	{
		fclose(ssc32.pfSaveFile); 
		ssc32.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSSC32(&ssc32);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}